

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O2

void __thiscall trun::TestRunner::DumpTestsToRun(TestRunner *this)

{
  element_type *peVar1;
  __shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  Config *pCVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  undefined8 uVar7;
  long lVar8;
  uint uVar9;
  __shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  Ref t;
  
  if ((this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0 ||
      (this->globalMain).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pCVar4 = Config::Instance();
    printf("%c Globals:\n",(ulong)((pCVar4->testGlobalMain ^ 1) * 3 + 0x2a));
    peVar1 = (this->globalMain).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      printf("    ::%s (%s)\n",(peVar1->caseName)._M_dataplus._M_p,
             (peVar1->symbolName)._M_dataplus._M_p);
    }
    peVar1 = (this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      printf("    ::%s (%s)\n",(peVar1->caseName)._M_dataplus._M_p,
             (peVar1->symbolName)._M_dataplus._M_p);
    }
  }
  uVar6 = 0;
  uVar9 = 0;
  for (p_Var5 = (this->testModules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->testModules)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    bVar3 = TestModule::ShouldExecute(*(TestModule **)(p_Var5 + 2));
    printf("%c Module: %s\n",(ulong)((uint)!bVar3 + (uint)!bVar3 * 2 + 0x2a),
           *(undefined8 *)(p_Var5 + 1));
    lVar8 = *(long *)(p_Var5 + 2);
    if (*(long *)(lVar8 + 0x80) != 0) {
      std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)(lVar8 + 0x80));
      bVar3 = TestFunc::ShouldExecuteNoDeps
                        (t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      uVar7 = 0x20;
      if (bVar3) {
        bVar3 = TestModule::ShouldExecute(*(TestModule **)(p_Var5 + 2));
        uVar7 = 0x20;
        if (bVar3) {
          uVar7 = 0x2a;
        }
      }
      printf("  %cm %s (%s)\n",uVar7,
             ((t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->caseName).
             _M_dataplus._M_p,
             ((t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->symbolName)
             ._M_dataplus._M_p);
      uVar6 = uVar6 + 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      lVar8 = *(long *)(p_Var5 + 2);
    }
    if (*(long *)(lVar8 + 0x90) != 0) {
      std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)(lVar8 + 0x90));
      bVar3 = TestFunc::ShouldExecuteNoDeps
                        (t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      uVar7 = 0x20;
      if (bVar3) {
        bVar3 = TestModule::ShouldExecute(*(TestModule **)(p_Var5 + 2));
        uVar7 = 0x20;
        if (bVar3) {
          uVar7 = 0x2a;
        }
      }
      printf("  %ce %s (%s)\n",uVar7,
             ((t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->caseName).
             _M_dataplus._M_p,
             ((t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->symbolName)
             ._M_dataplus._M_p);
      uVar6 = uVar6 + 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      lVar8 = *(long *)(p_Var5 + 2);
    }
    p_Var2 = *(__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 0x170);
    for (p_Var10 = *(__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 0x168);
        p_Var10 != p_Var2; p_Var10 = p_Var10 + 1) {
      std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>,p_Var10);
      bVar3 = TestFunc::ShouldExecuteNoDeps
                        (t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      uVar7 = 0x20;
      if (bVar3) {
        bVar3 = TestModule::ShouldExecute(*(TestModule **)(p_Var5 + 2));
        uVar7 = 0x2a;
        if (!bVar3) {
          uVar7 = 0x20;
        }
      }
      printf("  %c  %s::%s (%s)\n",uVar7,*(undefined8 *)(p_Var5 + 1),
             ((t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->caseName).
             _M_dataplus._M_p,
             ((t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->symbolName)
             ._M_dataplus._M_p);
      uVar6 = uVar6 + 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    uVar9 = uVar9 + 1;
  }
  printf("=== Modules: %d\n",(ulong)uVar9);
  printf("=== Cases..: %d\n",(ulong)uVar6);
  return;
}

Assistant:

void TestRunner::DumpTestsToRun() {
    int nModules = 0;
    int nTestCases = 0;

    // Dump 'test_main' / 'test_exit' (i.e. global main/exit)
    if ((globalMain != nullptr) || (globalExit != nullptr)){
        printf("%c Globals:\n", Config::Instance().testGlobalMain?'*':'-');
        if (globalMain != nullptr) {
            printf("    ::%s (%s)\n", globalMain->CaseName().c_str(), globalMain->SymbolName().c_str());
        }
        if (globalExit != nullptr) {
            printf("    ::%s (%s)\n", globalExit->CaseName().c_str(), globalExit->SymbolName().c_str());
        }
    }

    // Dump info for each module...
    for(auto &[moduleName, module] : testModules) {
        bool bExec = module->ShouldExecute();
        printf("%c Module: %s\n",bExec?'*':'-',moduleName.c_str());
        if (module->mainFunc != nullptr) {
            auto t = module->mainFunc;
            bool bExecTest = t->ShouldExecuteNoDeps() && module->ShouldExecute();
            printf("  %cm %s (%s)\n", bExecTest?'*':' ',t->CaseName().c_str(), t->SymbolName().c_str());
            nTestCases++;
        }
        if (module->exitFunc != nullptr) {
            auto t = module->exitFunc;
            bool bExecTest = t->ShouldExecuteNoDeps() && module->ShouldExecute();
            printf("  %ce %s (%s)\n",bExecTest?'*':' ', t->CaseName().c_str(), t->SymbolName().c_str());
            nTestCases++;
        }
        for(auto t : module->testFuncs) {
            bool bExecTest = t->ShouldExecuteNoDeps() && module->ShouldExecute();
            printf("  %c  %s::%s (%s)\n", bExecTest?'*':' ',moduleName.c_str(), t->CaseName().c_str(), t->SymbolName().c_str());
            nTestCases++;
        }
        nModules++;
    }
    printf("=== Modules: %d\n", nModules);
    printf("=== Cases..: %d\n", nTestCases);
}